

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

void __thiscall
Lib::
Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::clear(Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
        *this)

{
  Entry *pEVar1;
  ulong uVar2;
  
  pEVar1 = this->_entries;
  if (pEVar1 != (Entry *)0x0) {
    if ((long)this->_capacity == 0) {
      *(undefined8 *)pEVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pEVar1;
    }
    else {
      uVar2 = (long)this->_capacity * 0x20;
      if (uVar2 < 0x21) {
        *(undefined8 *)pEVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pEVar1;
      }
      else if (uVar2 < 0x31) {
        *(undefined8 *)pEVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pEVar1;
      }
      else if (uVar2 < 0x41) {
        *(undefined8 *)pEVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pEVar1;
      }
      else {
        operator_delete(pEVar1,0x10);
      }
    }
  }
  *(undefined8 *)((long)&this->_entries + 4) = 0;
  *(undefined8 *)((long)&this->_afterLast + 4) = 0;
  this->_capacity = 0;
  this->_noOfEntries = 0;
  this->_entries = (Entry *)0x0;
  return;
}

Assistant:

void clear()
  {
    if (_entries) {
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,sizeof(Entry)*_capacity,"Map<>");
    }
    _capacity    = 0;
    _noOfEntries = 0;
    _entries     = nullptr;
    _afterLast   = nullptr;
    _maxEntries  = 0;
  }